

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringAlgorithm.cpp
# Opt level: O2

string * CppWebSpider::strip(string *__return_storage_ptr__,string *target,string *s)

{
  ulong uVar1;
  size_t j;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar1 = s->_M_string_length;
  uVar6 = target->_M_string_length;
  lVar7 = uVar6 - uVar1;
  if (uVar6 < uVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)target);
  }
  else {
    uVar3 = 0;
    while (uVar5 = uVar3, uVar5 < uVar6) {
      uVar2 = uVar5;
      for (uVar4 = 0;
          (uVar3 = uVar1 + uVar5, uVar1 != uVar4 &&
          (uVar3 = uVar2, (s->_M_dataplus)._M_p[uVar4] == (target->_M_dataplus)._M_p[uVar2]));
          uVar4 = uVar4 + 1) {
        uVar2 = uVar2 + 1;
      }
      if ((uVar3 == uVar5) || (uVar3 % uVar1 != 0)) break;
    }
    do {
      uVar6 = uVar6 - uVar1;
      if (uVar6 <= uVar5) break;
      for (uVar3 = 0;
          (uVar1 != uVar3 &&
          ((s->_M_dataplus)._M_p[uVar3] == (target->_M_dataplus)._M_p[uVar3 + lVar7]));
          uVar3 = uVar3 + 1) {
      }
      lVar7 = lVar7 - uVar1;
    } while (uVar1 == uVar3);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)target);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string strip(std::string target,std::string s){
		size_t n=s.size(),m=target.size();
		if(m<n)
			return target;
		size_t start=0,i=0;
		while(i<m){
			for(size_t j=0;j<n;j++){
				if(s[j]!=target[i])
					break;
				i++;
			}
			if(i==start)
				break;
			if(i%n==0)
				start=i;
			else
				break;
		}
		size_t end=m;
		i=end-n;
		while(i>start){
			for(size_t j=0;j<n;j++){
				if(s[j]!=target[i])
					break;
				i++;
			}
			if(i==end)
				end-=n;
			else
				break;
			i=end-n;
		}
		std::string ans=target.substr(start,end-start);
		return ans;
	}